

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O1

void __thiscall QDir::setSorting(QDir *this,SortFlags sort)

{
  QDirPrivate *pQVar1;
  
  pQVar1 = (this->d_ptr).d.ptr;
  if ((pQVar1 != (QDirPrivate *)0x0) &&
     ((__atomic_base<int>)
      *(__int_type_conflict *)
       &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value != (__atomic_base<int>)0x1)) {
    QSharedDataPointer<QDirPrivate>::detach_helper(&this->d_ptr);
  }
  pQVar1 = (this->d_ptr).d.ptr;
  QDirPrivate::clearCache(pQVar1,KeepMetaData);
  (pQVar1->sort).super_QFlagsStorageHelper<QDir::SortFlag,_4>.super_QFlagsStorage<QDir::SortFlag>.i
       = (Int)sort.super_QFlagsStorageHelper<QDir::SortFlag,_4>.super_QFlagsStorage<QDir::SortFlag>.
              i;
  return;
}

Assistant:

void QDir::setSorting(SortFlags sort)
{
    Q_D(QDir);
    d->clearCache(QDirPrivate::KeepMetaData);
    d->sort = sort;
}